

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall clinet::on_package(clinet *this,int netid,char *data,int len)

{
  bool bVar1;
  int local_78;
  int local_74;
  action_req req_1;
  status_ntf *ntf_3;
  action_ntf *ntf_2;
  action_rsp *rsp_2;
  quit_ntf *ntf_1;
  join_ntf *ntf;
  join_rsp *rsp_1;
  int *piStack_38;
  join_req req;
  login_rsp *rsp;
  message *_msg;
  int len_local;
  char *data_local;
  int netid_local;
  clinet *this_local;
  
  switch(*(undefined4 *)data) {
  case 2:
    piStack_38 = (int *)(data + 4);
    if (*piStack_38 != 0) {
      __assert_fail("rsp->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                    ,0x2e,"virtual void clinet::on_package(int, char *, int)");
    }
    this->userid_ = *(int *)(data + 8);
    printf(anon_var_dwarf_13e);
    memset((void *)((long)&rsp_1 + 4),0,4);
    printf(anon_var_dwarf_154);
    __isoc99_scanf("%d",(long)&rsp_1 + 4);
    send_message(this,3,(void *)((long)&rsp_1 + 4),4);
    break;
  default:
    printf(anon_var_dwarf_22a,(ulong)*(uint *)data);
    break;
  case 4:
    if (*(int *)(data + 4) != 0) {
      __assert_fail("rsp->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                    ,0x3c,"virtual void clinet::on_package(int, char *, int)");
    }
    printf(anon_var_dwarf_168);
    break;
  case 5:
    printf(anon_var_dwarf_17e,(ulong)*(uint *)(data + 4),data + 8);
    break;
  case 6:
    printf(anon_var_dwarf_194,(ulong)*(uint *)(data + 4),data + 8);
    break;
  case 8:
    if (*(int *)(data + 4) != 0) {
      __assert_fail("rsp->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                    ,0x4f,"virtual void clinet::on_package(int, char *, int)");
    }
    break;
  case 9:
    printf(anon_var_dwarf_19e,(ulong)*(uint *)(data + 4),data + 8,(ulong)*(uint *)(data + 0x28),
           (ulong)*(uint *)(data + 0x2c));
    break;
  case 10:
    req_1 = (action_req)((long)data + 4);
    if (*(int *)(data + 8) == 0) {
      printf(anon_var_dwarf_1b4);
    }
    else if (*(int *)(data + 8) == 3) {
      printf(anon_var_dwarf_1be);
    }
    else {
      draw_chesses(data + 0xc);
      if (*(int *)((long)req_1 + 4) == 2) {
        printf(anon_var_dwarf_1d4,(ulong)*(uint *)((long)req_1 + 0x108),(long)req_1 + 0x10c);
      }
      else if (*(int *)((long)req_1 + 4) == 1) {
        if (this->userid_ == *(int *)((long)req_1 + 0x108)) {
          memset(&local_78,0,8);
          while( true ) {
            printf(anon_var_dwarf_1f4);
            __isoc99_scanf("%d,%d",&local_78,&local_74);
            bVar1 = check_valid((char *)((long)req_1 + 8),local_78,local_74);
            if (bVar1) break;
            printf(anon_var_dwarf_214);
          }
          send_message(this,7,&local_78,8);
        }
        else {
          printf(anon_var_dwarf_1de,(ulong)*(uint *)((long)req_1 + 0x108),(long)req_1 + 0x10c);
        }
      }
    }
  }
  return;
}

Assistant:

void on_package(int netid, char* data, int len) override
    {
        message* _msg = (message*)data;
        switch (_msg->msgid)
        {
        case MSG_LOGIN_RSP:
        {
            login_rsp* rsp = (login_rsp*)_msg->body;
            assert(rsp->result == 0);
            
            userid_ = rsp->userid;
            printf("登录游戏成功，你的ID为%d\n", userid_);
            
            join_req req = { 0 };
            printf("请输入你要加入的房间id：");
            scanf("%d", &req.gameid);
            send_message(MSG_JOIN_REQ, &req, sizeof(req));
            break;
        }
        case MSG_JOIN_RSP:
        {
            join_rsp* rsp = (join_rsp*)_msg->body;
            assert(rsp->result == 0);
            printf("加入房间成功\n");
            break;
        }
        case MSG_JOIN_NTF:
        {
            join_ntf* ntf = (join_ntf*)_msg->body;
            printf("玩家[%d]-%s 加入房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_QUIT_NTF:
        {
            quit_ntf* ntf = (quit_ntf*)_msg->body;
            printf("玩家[%d]-%s 退出房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_ACTION_RSP:
        {
            action_rsp* rsp = (action_rsp*)_msg->body;
            assert(rsp->result == 0);
            break;
        }
        case MSG_ACTION_NTF:
        {
            action_ntf* ntf = (action_ntf*)_msg->body;
            printf("玩家[%d]-%s 下了(%d,%d)\n", ntf->userid, ntf->name, ntf->row, ntf->col);
            break;
        }
        case MSG_STATUS_NTF:
        {
            status_ntf* ntf = (status_ntf*)_msg->body;
            if (ntf->state == STATE_WAITING) {
                printf("等待对手加入\n");
                return;
            }

            if (ntf->state == STATE_ABORTED) {
                printf("有棋手退出，游戏中止\n");
                return;
            }

            draw_chesses(ntf->chesses);
            if (ntf->state == STATE_FINISH) {
                printf("游戏结束，玩家[%d]-%s胜利\n", ntf->userid, ntf->name);
                return;
            }

            if (ntf->state == STATE_PLAYING) {
                if (userid_ != ntf->userid) {
                    printf("等待玩家[%d]-%s下棋\n", ntf->userid, ntf->name);
                    return;
                }
                
                action_req req = { 0 };
                while (true)
                {
                    printf("轮到你下棋，请输入坐标(x,y)：");
                    scanf("%d,%d", &req.row, &req.col);
                    if (check_valid(ntf->chesses, req.row, req.col)) {
                        break;
                    }
                    printf("你的输入无效，请重新输入\n");
                }
                send_message(MSG_ACTION_REQ, &req, sizeof(req));
            }
            
            break;
        }
        default:
        {
            printf("未知的消息id(%d)\n", _msg->msgid);
            break;
        }
        }
    }